

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amapMatch.c
# Opt level: O3

float Amap_ManComputeMapping(Amap_Man_t *p)

{
  uint uVar1;
  void **ppvVar2;
  Vec_Ptr_t *pVVar3;
  int iVar4;
  long lVar5;
  float fVar6;
  float fVar7;
  
  pVVar3 = p->vObjs;
  iVar4 = pVVar3->nSize;
  if (0 < iVar4) {
    ppvVar2 = pVVar3->pArray;
    lVar5 = 0;
    do {
      if (ppvVar2[lVar5] != (void *)0x0) {
        *(undefined8 *)((long)ppvVar2[lVar5] + 0x2c) = 0;
        iVar4 = pVVar3->nSize;
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 < iVar4);
  }
  pVVar3 = p->vPos;
  if (pVVar3->nSize < 1) {
    fVar6 = 0.0;
  }
  else {
    fVar6 = 0.0;
    lVar5 = 0;
    do {
      uVar1 = *(uint *)((long)pVVar3->pArray[lVar5] + 0x14);
      if ((int)uVar1 < 0) {
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                      ,0x10c,"int Abc_Lit2Var(int)");
      }
      if (p->vObjs->nSize <= (int)(uVar1 >> 1)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      fVar7 = Amap_ManComputeMapping_rec(p,(Amap_Obj_t *)p->vObjs->pArray[uVar1 >> 1],uVar1 & 1);
      fVar6 = fVar6 + fVar7;
      lVar5 = lVar5 + 1;
      pVVar3 = p->vPos;
    } while (lVar5 < pVVar3->nSize);
  }
  return fVar6;
}

Assistant:

float Amap_ManComputeMapping( Amap_Man_t * p )
{
    Amap_Obj_t * pObj;
    float Area = 0.0;
    int i;
    Amap_ManCleanRefs( p );
    Amap_ManForEachPo( p, pObj, i )
        Area += Amap_ManComputeMapping_rec( p, Amap_ObjFanin0(p, pObj), Amap_ObjFaninC0(pObj) );
    return Area;
}